

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageant.c
# Opt level: O2

int pageant_reencrypt_key(pageant_pubkey *key,char **retstr)

{
  uint uVar1;
  int iVar2;
  PageantClientOp *pco;
  char *pcVar3;
  ptrlen pl;
  
  pco = pageant_client_op_new();
  if (key->ssh_version == 1) {
    pcVar3 = dupstr("Can\'t re-encrypt an SSH-1 key");
    *retstr = pcVar3;
    pageant_client_op_free(pco);
    return 1;
  }
  BinarySink_put_byte(pco->binarysink_,'\x1b');
  pl.len = 0x25;
  pl.ptr = "reencrypt@putty.projects.tartarus.org";
  BinarySink_put_stringpl(pco->binarysink_,pl);
  BinarySink_put_string(pco->binarysink_,key->blob->s,key->blob->len);
  uVar1 = pageant_client_op_query(pco);
  pageant_client_op_free(pco);
  if (uVar1 == 5) {
    pcVar3 = "Agent doesn\'t support encrypted keys";
  }
  else {
    if (uVar1 == 6) {
      pcVar3 = (char *)0x0;
      iVar2 = 0;
      goto LAB_0011429a;
    }
    pcVar3 = "Agent failed to re-encrypt key";
  }
  pcVar3 = dupstr(pcVar3);
  iVar2 = 1;
LAB_0011429a:
  *retstr = pcVar3;
  return iVar2;
}

Assistant:

int pageant_reencrypt_key(struct pageant_pubkey *key, char **retstr)
{
    PageantClientOp *pco = pageant_client_op_new();

    if (key->ssh_version == 1) {
        *retstr = dupstr("Can't re-encrypt an SSH-1 key");
        pageant_client_op_free(pco);
        return PAGEANT_ACTION_FAILURE;
    } else {
        put_byte(pco, SSH2_AGENTC_EXTENSION);
        put_stringpl(pco, extension_names[EXT_REENCRYPT]);
        put_string(pco, key->blob->s, key->blob->len);
    }

    unsigned reply = pageant_client_op_query(pco);
    pageant_client_op_free(pco);

    if (reply != SSH_AGENT_SUCCESS) {
        if (reply == SSH_AGENT_FAILURE) {
            /* The agent didn't understand the protocol extension at all. */
            *retstr = dupstr("Agent doesn't support encrypted keys");
        } else {
            *retstr = dupstr("Agent failed to re-encrypt key");
        }
        return PAGEANT_ACTION_FAILURE;
    } else {
        *retstr = NULL;
        return PAGEANT_ACTION_OK;
    }
}